

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array_defs.h
# Opt level: O1

void __thiscall ON_SimpleArray<double>::Insert(ON_SimpleArray<double> *this,int i,double *x)

{
  int iVar1;
  double *memblock;
  int iVar2;
  uint uVar3;
  
  if ((-1 < i) && (i <= this->m_count)) {
    memblock = x;
    if (this->m_count == this->m_capacity) {
      if (x < this->m_a + (uint)this->m_capacity && this->m_a <= x) {
        memblock = (double *)onmalloc(8);
        *memblock = *x;
      }
      iVar1 = this->m_count;
      if ((long)iVar1 < 8 || (ulong)((long)iVar1 << 3) < 0x10000001) {
        uVar3 = 4;
        if (2 < iVar1) {
          uVar3 = iVar1 * 2;
        }
      }
      else {
        iVar2 = 0x2000008;
        if (iVar1 < 0x2000008) {
          iVar2 = iVar1;
        }
        uVar3 = iVar2 + iVar1;
      }
      if ((uint)this->m_capacity < uVar3) {
        SetCapacity(this,(long)(int)uVar3);
      }
    }
    iVar1 = this->m_count;
    this->m_count = iVar1 + 1;
    Move(this,i + 1,i,iVar1 - i);
    this->m_a[(uint)i] = *memblock;
    if (memblock != x) {
      onfree(memblock);
      return;
    }
  }
  return;
}

Assistant:

void ON_SimpleArray<T>::Insert( int i, const T& x ) 
{
  if( i >= 0 && i <= m_count ) 
  {
    const T* p = &x;
    if ( m_count == m_capacity ) 
    {
      if (&x >= m_a && &x < (m_a + m_capacity))
      {
        // x is in the block of memory about to be reallocated.
        void* temp = onmalloc(sizeof(T));
        memcpy(temp, p, sizeof(T));
        p = (T*)temp;
      }
      int newcapacity = NewCapacity();
      Reserve( newcapacity );
    }
	  m_count++;
    Move( i+1, i, m_count-1-i );
	  m_a[i] = *p;
    if (p != &x)
      onfree((void*)p);
  }
}